

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_MinipointCounterTest_EdgeWait_TestShell::createTest
          (TEST_MinipointCounterTest_EdgeWait_TestShell *this)

{
  TEST_MinipointCounterTest_EdgeWait_Test *this_00;
  
  this_00 = (TEST_MinipointCounterTest_EdgeWait_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                         ,0x8a);
  TEST_MinipointCounterTest_EdgeWait_Test::TEST_MinipointCounterTest_EdgeWait_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, EdgeWait)
{
	addOpenNoPointHand();

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));

	h.last_tile = Tile::SevenOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}